

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetInitStep(void *arkode_mem,realtype hin)

{
  long lVar1;
  int iVar2;
  
  if (arkode_mem == (void *)0x0) {
    iVar2 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetInitStep","arkode_mem = NULL illegal.");
  }
  else {
    *(ulong *)((long)arkode_mem + 0x160) = ~-(ulong)(hin == 0.0) & (ulong)hin;
    *(undefined8 *)((long)arkode_mem + 0x228) = 0;
    lVar1 = *(long *)((long)arkode_mem + 0x1b0);
    *(undefined8 *)(lVar1 + 0x40) = 0x3ff0000000000000;
    *(undefined8 *)(lVar1 + 0x48) = 0x3ff0000000000000;
    *(undefined8 *)(lVar1 + 0x50) = 0;
    *(undefined8 *)(lVar1 + 0x58) = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int arkSetInitStep(void *arkode_mem, realtype hin)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetInitStep", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* Passing hin=0 sets the default, otherwise use input. */
  if (hin == ZERO) {
    ark_mem->hin = ZERO;
  } else {
    ark_mem->hin = hin;
  }

  /* Clear previous initial step */
  ark_mem->h0u = ZERO;

  /* Clear error and step size history */
  ark_mem->hadapt_mem->ehist[0] = ONE;
  ark_mem->hadapt_mem->ehist[1] = ONE;
  ark_mem->hadapt_mem->hhist[0] = ZERO;
  ark_mem->hadapt_mem->hhist[1] = ZERO;

  return(ARK_SUCCESS);
}